

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool r_exec::IPGMContext::Ins(IPGMContext *context,uint16_t *index)

{
  IPGMContext *this;
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  undefined4 extraout_var;
  Code *destination;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint16_t index_00;
  Atom *pAVar8;
  ulong uVar9;
  Atom aAStack_2a8 [4];
  Atom local_2a4 [4];
  Atom local_2a0 [4];
  Atom local_29c [4];
  Atom local_298 [6];
  short local_292;
  IPGMContext *local_290;
  Code *local_288;
  uint local_280;
  Atom local_27c [4];
  Atom local_278 [4];
  Atom local_274 [4];
  IPGMContext arg;
  uint16_t extent_index;
  IPGMContext tsc;
  IPGMContext args;
  IPGMContext nfr;
  IPGMContext res;
  IPGMContext run;
  IPGMContext pattern_set;
  IPGMContext object;
  IPGMContext local_c0;
  IPGMContext local_90;
  IPGMContext local_60;
  
  pAVar8 = aAStack_2a8;
  getChild(&args,context,1);
  operator*(&object,&args);
  getChild(&run,context,2);
  operator*(&args,&run);
  getChild(&tsc,context,3);
  operator*(&run,&tsc);
  getChild(&res,context,4);
  operator*(&tsc,&res);
  getChild(&nfr,context,5);
  operator*(&res,&nfr);
  getChild(&pattern_set,context,6);
  operator*(&nfr,&pattern_set);
  (*((object.object)->super__Object)._vptr__Object[4])(object.object,0);
  sVar5 = r_code::Atom::asOpcode();
  if ((sVar5 == Opcodes::Pgm) || (sVar5 == Opcodes::AntiPgm)) {
    local_292 = sVar5;
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x3f) {
      (*((object.object)->super__Object)._vptr__Object[4])(object.object,1);
      uVar6 = r_code::Atom::asIndex();
      bVar2 = r_code::Atom::getAtomCount();
      (*((object.object)->super__Object)._vptr__Object[4])(object.object,(ulong)uVar6);
      bVar3 = r_code::Atom::getAtomCount();
      if (bVar3 == bVar2) {
        local_290 = context;
        iVar7 = (*((object.object)->super__Object)._vptr__Object[4])(object.object,0);
        pattern_set.super__Context.code = (Atom *)CONCAT44(extraout_var,iVar7);
        pattern_set.super__Context.overlay = (Overlay *)0x0;
        pattern_set.super__Context.data = REFERENCE;
        pattern_set.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
        local_288 = object.object;
        pattern_set.object = object.object;
        pattern_set.view = (View *)0x0;
        local_280 = (uint)bVar2;
        index_00 = 1;
        pattern_set.super__Context.index = uVar6;
        do {
          if ((uint16_t)(index_00 - bVar2) == 1) {
            if (local_292 == Opcodes::AntiPgm) {
              pAVar8 = local_274;
              r_code::Atom::InstantiatedAntiProgram((ushort)pAVar8,(uchar)Opcodes::IPgm);
              destination = build_object(local_290,pAVar8);
            }
            else {
              (*(local_288->super__Object)._vptr__Object[4])(local_288,2);
              uVar6 = r_code::Atom::asIndex();
              (*(local_288->super__Object)._vptr__Object[4])(local_288,(ulong)uVar6);
              this = local_290;
              cVar1 = r_code::Atom::getAtomCount();
              if (cVar1 == '\0') {
                pAVar8 = local_278;
                r_code::Atom::InstantiatedInputLessProgram((ushort)pAVar8,(uchar)Opcodes::IPgm);
                destination = build_object(this,pAVar8);
              }
              else {
                pAVar8 = local_27c;
                r_code::Atom::InstantiatedProgram((ushort)pAVar8,(uchar)Opcodes::IPgm);
                destination = build_object(this,pAVar8);
              }
            }
            r_code::Atom::~Atom(pAVar8);
            r_code::Atom::RPointer((ushort)&arg);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,1);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar7),(Atom *)&arg);
            r_code::Atom::~Atom((Atom *)&arg);
            (*(destination->super__Object)._vptr__Object[0x19])(destination,local_288);
            extent_index = 0;
            r_code::Atom::IPointer((ushort)&arg);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,2);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar7),(Atom *)&arg);
            r_code::Atom::~Atom((Atom *)&arg);
            copy<r_code::Code>(&args,destination,8,&extent_index);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,3);
            r_code::Atom::operator=
                      ((Atom *)CONCAT44(extraout_var_02,iVar7),
                       run.super__Context.code + (ulong)run.super__Context.index * 4);
            r_code::Atom::IPointer((ushort)&arg);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,4);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar7),(Atom *)&arg);
            r_code::Atom::~Atom((Atom *)&arg);
            pAVar8 = tsc.super__Context.code;
            uVar9 = (ulong)tsc.super__Context.index;
            extent_index = extent_index + 1;
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar7),pAVar8 + uVar9 * 4);
            pAVar8 = tsc.super__Context.code;
            uVar9 = (ulong)tsc.super__Context.index;
            extent_index = extent_index + 1;
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar7),pAVar8 + uVar9 * 4 + 4);
            extent_index = extent_index + 1;
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination);
            r_code::Atom::operator=
                      ((Atom *)CONCAT44(extraout_var_06,iVar7),
                       tsc.super__Context.code + (ulong)tsc.super__Context.index * 4 + 8);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,5);
            r_code::Atom::operator=
                      ((Atom *)CONCAT44(extraout_var_07,iVar7),
                       res.super__Context.code + (ulong)res.super__Context.index * 4);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,6);
            r_code::Atom::operator=
                      ((Atom *)CONCAT44(extraout_var_08,iVar7),
                       nfr.super__Context.code + (ulong)nfr.super__Context.index * 4);
            r_code::Atom::Float(1.0);
            iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,7);
            r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar7),(Atom *)&arg);
            r_code::Atom::~Atom((Atom *)&arg);
            addProduction(local_290,destination,false);
            r_code::Atom::ProductionPointer((ushort)local_2a4);
            _Context::setAtomicResult(&local_290->super__Context,local_2a4);
            pAVar8 = local_2a4;
LAB_0017408e:
            r_code::Atom::~Atom(pAVar8);
            return (ushort)local_280 < index_00;
          }
          getChild((IPGMContext *)&extent_index,&args,index_00);
          operator*(&arg,(IPGMContext *)&extent_index);
          getChild(&local_c0,&pattern_set,index_00);
          operator*(&local_90,&local_c0);
          getChild(&local_60,&local_90,1);
          operator*((IPGMContext *)&extent_index,&local_60);
          bVar4 = match((IPGMContext *)&extent_index,&arg);
          if (!bVar4) {
            r_code::Atom::Nil();
            _Context::setAtomicResult(&local_290->super__Context,local_2a0);
            pAVar8 = local_2a0;
            goto LAB_0017408e;
          }
          index_00 = index_00 + 1;
        } while( true );
      }
      r_code::Atom::Nil();
      _Context::setAtomicResult(&context->super__Context,local_29c);
      pAVar8 = local_29c;
    }
    else {
      r_code::Atom::Nil();
      _Context::setAtomicResult(&context->super__Context,aAStack_2a8);
    }
  }
  else {
    r_code::Atom::Nil();
    _Context::setAtomicResult(&context->super__Context,local_298);
    pAVar8 = local_298;
  }
  r_code::Atom::~Atom(pAVar8);
  return false;
}

Assistant:

bool IPGMContext::Ins(const IPGMContext &context, uint16_t &index)
{
    IPGMContext object = *context.getChild(1);
    IPGMContext args = *context.getChild(2);
    IPGMContext run = *context.getChild(3);
    IPGMContext tsc = *context.getChild(4);
    IPGMContext res = *context.getChild(5);
    IPGMContext nfr = *context.getChild(6);
    Code *pgm = object.getObject();
    uint16_t pgm_opcode = pgm->code(0).asOpcode();

    if (pgm_opcode != Opcodes::Pgm &&
        pgm_opcode != Opcodes::AntiPgm) {
        context.setAtomicResult(Atom::Nil());
        return false;
    }

    if (pgm && args[0].getDescriptor() == Atom::SET) {
        uint16_t pattern_set_index = pgm->code(PGM_TPL_ARGS).asIndex();
        uint16_t arg_count = args[0].getAtomCount();

        if (pgm->code(pattern_set_index).getAtomCount() != arg_count) {
            context.setAtomicResult(Atom::Nil());
            return false;
        }

        // match args with the tpl patterns in _object.
        IPGMContext pattern_set(pgm, pattern_set_index);

        for (uint16_t i = 1; i <= arg_count; ++i) {
            IPGMContext arg = *args.getChild(i);
            IPGMContext skel = *(*pattern_set.getChild(i)).getChild(1);

            if (!skel.match(arg)) {
                context.setAtomicResult(Atom::Nil());
                return false;
            }
        }

        Code *ipgm; // created in the production array.

        if (pgm_opcode == Opcodes::AntiPgm) {
            ipgm = context.build_object(Atom::InstantiatedAntiProgram(Opcodes::IPgm, IPGM_ARITY));
        } else {
            uint16_t input_index = pgm->code(PGM_INPUTS).asIndex();
            uint16_t input_count = pgm->code(input_index).getAtomCount();

            if (input_count == 0) {
                ipgm = context.build_object(Atom::InstantiatedInputLessProgram(Opcodes::IPgm, IPGM_ARITY));
            } else {
                ipgm = context.build_object(Atom::InstantiatedProgram(Opcodes::IPgm, IPGM_ARITY));
            }
        }

        ipgm->code(IPGM_PGM) = Atom::RPointer(0); // points to the pgm object.
        ipgm->add_reference(pgm);
        uint16_t extent_index = 0;
        ipgm->code(IPGM_ARGS) = Atom::IPointer(IPGM_ARITY + 1); // points to the arg set.
        args.copy(ipgm, IPGM_ARITY + 1, extent_index); // writes the args after psln_thr.
        ipgm->code(IPGM_RUN) = run[0];
        ipgm->code(IPGM_TSC) = Atom::IPointer(extent_index); // points to the tsc.
        ipgm->code(extent_index++) = tsc[0]; // writes the tsc after the args.
        ipgm->code(extent_index++) = tsc[1];
        ipgm->code(extent_index++) = tsc[2];
        ipgm->code(IPGM_RES) = res[0]; // res.
        ipgm->code(IPGM_NFR) = nfr[0]; // nfr.
        ipgm->code(IPGM_ARITY) = Atom::Float(1); // psln_thr.
        context.setAtomicResult(Atom::ProductionPointer(context.addProduction(ipgm, true))); // object may be new: we don't know at this point, therefore check=true.
        return true;
    }

    context.setAtomicResult(Atom::Nil());
    return false;
}